

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

astcenc_error
astcenc_compress_image
          (astcenc_context *ctxo,astcenc_image *imagep,astcenc_swizzle *swizzle,uint8_t *data_out,
          size_t data_len,uint thread_index)

{
  int *in_RSI;
  int *__stat_loc;
  void *__stat_loc_00;
  long in_RDI;
  ulong in_R8;
  uint in_R9D;
  anon_class_8_1_ba1d3d87 term_compress;
  anon_class_24_3_4d6db681 init_avg;
  size_t size_needed;
  uint zblocks;
  uint yblocks;
  uint xblocks;
  uint block_z;
  uint block_y;
  uint block_x;
  astcenc_image *image;
  astcenc_error status;
  astcenc_contexti *ctx;
  uint8_t *in_stack_00001070;
  astcenc_swizzle *in_stack_00001078;
  astcenc_image *in_stack_00001080;
  uint in_stack_0000108c;
  astcenc_context *in_stack_00001090;
  astcenc_context *in_stack_fffffffffffffef8;
  anon_class_24_3_4d6db681 *in_stack_ffffffffffffff08;
  ParallelManager *in_stack_ffffffffffffff10;
  function<void_()> *in_stack_ffffffffffffff18;
  anon_class_8_1_ba1d3d87 in_stack_ffffffffffffff20;
  avg_args *in_stack_ffffffffffffff68;
  astcenc_context *in_stack_ffffffffffffff70;
  astcenc_error local_4;
  
  if ((*(uint *)(in_RDI + 4) & 0x10) == 0) {
    __stat_loc = in_RSI;
    local_4 = validate_compression_swizzle((astcenc_swizzle *)in_stack_fffffffffffffef8);
    if (local_4 == ASTCENC_SUCCESS) {
      if (in_R9D < *(uint *)(in_RDI + 0x78)) {
        if (in_R8 < (((*in_RSI + *(uint *)(in_RDI + 8)) - 1) / *(uint *)(in_RDI + 8)) *
                    (((in_RSI[1] + *(uint *)(in_RDI + 0xc)) - 1) / *(uint *)(in_RDI + 0xc)) *
                    (((in_RSI[2] + *(uint *)(in_RDI + 0x10)) - 1) / *(uint *)(in_RDI + 0x10)) * 0x10
           ) {
          local_4 = ASTCENC_ERR_OUT_OF_MEM;
        }
        else {
          if (*(int *)(in_RDI + 0x78) == 1) {
            astcenc_compress_reset(in_stack_fffffffffffffef8);
          }
          if (*(int *)(in_RDI + 0x24) != 0) {
            in_stack_ffffffffffffff10 = (ParallelManager *)(in_RDI + 0xf0);
            in_stack_ffffffffffffff18 = (function<void_()> *)&stack0xffffffffffffff58;
            std::function<unsigned_int()>::
            function<astcenc_compress_image(astcenc_context*,astcenc_image*,astcenc_swizzle_const*,unsigned_char*,unsigned_long,unsigned_int)::__0&,void>
                      ((function<unsigned_int_()> *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff08);
            ParallelManager::init
                      (in_stack_ffffffffffffff10,(EVP_PKEY_CTX *)in_stack_ffffffffffffff18);
            std::function<unsigned_int_()>::~function((function<unsigned_int_()> *)0x54642b);
            __stat_loc = (int *)(in_RDI + 0x98);
            compute_averages(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          }
          ParallelManager::wait((ParallelManager *)(in_RDI + 0xf0),__stat_loc);
          __stat_loc_00 = (void *)(ulong)in_R9D;
          compress_image(in_stack_00001090,in_stack_0000108c,in_stack_00001080,in_stack_00001078,
                         in_stack_00001070);
          ParallelManager::wait((ParallelManager *)(in_RDI + 0x198),__stat_loc_00);
          std::function<void()>::
          function<astcenc_compress_image(astcenc_context*,astcenc_image*,astcenc_swizzle_const*,unsigned_char*,unsigned_long,unsigned_int)::__1&,void>
                    ((function<void_()> *)in_stack_ffffffffffffff10,
                     (anon_class_8_1_ba1d3d87 *)&stack0xffffffffffffff20);
          ParallelManager::term
                    ((ParallelManager *)in_stack_ffffffffffffff20.ctx,in_stack_ffffffffffffff18);
          std::function<void_()>::~function((function<void_()> *)0x546509);
          local_4 = ASTCENC_SUCCESS;
        }
      }
      else {
        local_4 = ASTCENC_ERR_BAD_PARAM;
      }
    }
  }
  else {
    local_4 = ASTCENC_ERR_BAD_CONTEXT;
  }
  return local_4;
}

Assistant:

astcenc_error astcenc_compress_image(
	astcenc_context* ctxo,
	astcenc_image* imagep,
	const astcenc_swizzle* swizzle,
	uint8_t* data_out,
	size_t data_len,
	unsigned int thread_index
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	(void)imagep;
	(void)swizzle;
	(void)data_out;
	(void)data_len;
	(void)thread_index;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	astcenc_error status;
	astcenc_image& image = *imagep;

	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	status = validate_compression_swizzle(*swizzle);
	if (status != ASTCENC_SUCCESS)
	{
		return status;
	}

	if (thread_index >= ctx->thread_count)
	{
		return ASTCENC_ERR_BAD_PARAM;
	}

	unsigned int block_x = ctx->config.block_x;
	unsigned int block_y = ctx->config.block_y;
	unsigned int block_z = ctx->config.block_z;

	unsigned int xblocks = (image.dim_x + block_x - 1) / block_x;
	unsigned int yblocks = (image.dim_y + block_y - 1) / block_y;
	unsigned int zblocks = (image.dim_z + block_z - 1) / block_z;

	// Check we have enough output space (16 bytes per block)
	size_t size_needed = xblocks * yblocks * zblocks * 16;
	if (data_len < size_needed)
	{
		return ASTCENC_ERR_OUT_OF_MEM;
	}

	// If context thread count is one then implicitly reset
	if (ctx->thread_count == 1)
	{
		astcenc_compress_reset(ctxo);
	}

	if (ctx->config.a_scale_radius != 0)
	{
		// First thread to enter will do setup, other threads will subsequently
		// enter the critical section but simply skip over the initialization
		auto init_avg = [ctx, &image, swizzle]() {
			// Perform memory allocations for the destination buffers
			size_t texel_count = image.dim_x * image.dim_y * image.dim_z;
			ctx->input_alpha_averages = new float[texel_count];

			return init_compute_averages(
				image, ctx->config.a_scale_radius, *swizzle,
				ctx->avg_preprocess_args);
		};

		// Only the first thread actually runs the initializer
		ctxo->manage_avg.init(init_avg);

		// All threads will enter this function and dynamically grab work
		compute_averages(*ctxo, ctx->avg_preprocess_args);
	}

	// Wait for compute_averages to complete before compressing
	ctxo->manage_avg.wait();

	compress_image(*ctxo, thread_index, image, *swizzle, data_out);

	// Wait for compress to complete before freeing memory
	ctxo->manage_compress.wait();

	auto term_compress = [ctx]() {
		delete[] ctx->input_alpha_averages;
		ctx->input_alpha_averages = nullptr;
	};

	// Only the first thread to arrive actually runs the term
	ctxo->manage_compress.term(term_compress);

	return ASTCENC_SUCCESS;
#endif
}